

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermConstantUnion::fold(TIntermConstantUnion *this,TOperator op,TType *returnType)

{
  pointer pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  TBasicType TVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer pTVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong *puVar8;
  TIntermTyped *pTVar9;
  TIntermConstantUnion *this_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar10;
  ulong *puVar11;
  TIntermConstantUnion *pTVar12;
  TConstUnionVector *s;
  char cVar13;
  TIntermConstantUnion *pTVar14;
  uint uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  TConstUnion TVar20;
  long lStack_a0;
  TConstUnionArray newConstArray;
  long local_60;
  
  iVar3 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  uVar4 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar3));
  s = (TConstUnionVector *)0x1;
  bVar2 = false;
  uVar15 = op - EOpPackSnorm2x16;
  uVar16 = (ulong)uVar15;
  if (uVar15 < 0x3b) {
    if ((0x10fc000000U >> (uVar16 & 0x3f) & 1) != 0) {
      bVar2 = false;
      goto LAB_0036cbd9;
    }
    if ((0x400000100000105U >> (uVar16 & 0x3f) & 1) == 0) {
      if ((0x20aUL >> (uVar16 & 0x3f) & 1) == 0) goto LAB_0036cc03;
      s = (TConstUnionVector *)0x2;
      bVar2 = false;
    }
  }
  else {
LAB_0036cc03:
    if (op - EOpEmitStreamVertex < 2) {
      return (TIntermTyped *)0x0;
    }
    if (1 < op - EOpAny) {
      bVar2 = true;
LAB_0036cbd9:
      s = (TConstUnionVector *)(ulong)uVar4;
    }
  }
  TConstUnionArray::TConstUnionArray(&newConstArray,(int)s);
  if (uVar15 < 0x3d) {
    if ((0x1c000000fc00030fU >> (uVar16 & 0x3f) & 1) != 0) {
      return (TIntermTyped *)0x0;
    }
    if ((0x1100000000U >> (uVar16 & 0x3f) & 1) == 0) goto LAB_0036cc6b;
    lVar10 = 0;
    uVar16 = 0;
    if (0 < (int)uVar4) {
      uVar16 = (ulong)uVar4;
    }
    dVar17 = 0.0;
    for (; uVar16 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      dVar18 = *(double *)
                ((long)&((((this->constArray).unionArray)->
                         super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ).
                         super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                         ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
      dVar17 = dVar17 + dVar18 * dVar18;
    }
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    if (op == EOpLength) {
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pTVar7->field_0).dConst = dVar17;
      TVar5 = EbtDouble;
      goto LAB_0036cd84;
    }
    for (lVar10 = 0; uVar16 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(double *)((long)&pTVar7->field_0 + lVar10) =
           *(double *)
            ((long)&((((this->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) / dVar17;
      *(undefined4 *)((long)&pTVar7->type + lVar10) = 2;
    }
LAB_0036cd87:
    if (!bVar2) {
LAB_0036d900:
      this_00 = (TIntermConstantUnion *)TIntermNode::operator_new((TIntermNode *)0xd0,(size_t)s);
      TIntermConstantUnion(this_00,&newConstArray,returnType);
      iVar3 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1f])(this_00);
      lVar10 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x50))
                         ((long *)CONCAT44(extraout_var_03,iVar3));
      *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xffffffffffffff80 | 2;
      iVar3 = (**(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(this);
      (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])
                (this_00,CONCAT44(extraout_var_04,iVar3));
switchD_0036cdd9_caseD_41:
      return &this_00->super_TIntermTyped;
    }
  }
  else {
LAB_0036cc6b:
    TVar5 = EbtBool;
    if (op == EOpAny) {
      lVar10 = 0;
      uVar16 = 0;
      if (0 < (int)uVar4) {
        uVar16 = (ulong)uVar4;
      }
      s = (this->constArray).unionArray;
      cVar13 = '\0';
      for (; uVar16 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        if (*(char *)((long)&((s->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) != '\0')
        {
          cVar13 = '\x01';
        }
      }
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pTVar7->field_0).i8Const = cVar13;
LAB_0036cd84:
      pTVar7->type = TVar5;
      goto LAB_0036cd87;
    }
    if (op == EOpAll) {
      uVar16 = 0;
      if (0 < (int)uVar4) {
        uVar16 = (ulong)uVar4;
      }
      s = (TConstUnionVector *)CONCAT71((int7)((ulong)s >> 8),1);
      for (lVar10 = 0; uVar16 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        s = (TConstUnionVector *)((ulong)s & 0xff);
        if (*(char *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) == '\0')
        {
          s = (TConstUnionVector *)0x0;
        }
      }
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (pTVar7->field_0).i8Const = (char)s;
      goto LAB_0036cd84;
    }
    if (!bVar2) {
      __assert_fail("componentWise",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                    ,0x1e3,
                    "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                   );
    }
  }
  pTVar12 = (TIntermConstantUnion *)0x0;
  pTVar14 = (TIntermConstantUnion *)(ulong)uVar4;
  if ((int)uVar4 < 1) {
    pTVar14 = pTVar12;
  }
  lVar10 = 0;
LAB_0036cdbd:
  if ((long)pTVar14 * 0x10 == lVar10) goto LAB_0036d900;
  this_00 = pTVar12;
  switch(op) {
  case EOpRadians:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = (*(double *)
               ((long)&((((this->constArray).unionArray)->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) *
             3.141592653589793) / 180.0;
    goto LAB_0036d7ee;
  case EOpDegrees:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = (*(double *)
               ((long)&((((this->constArray).unionArray)->
                        super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ).
                        super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) * 180.0) /
             3.141592653589793;
    goto LAB_0036d7ee;
  case EOpSin:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = sin(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpCos:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = cos(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpTan:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = tan(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpAsin:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = asin(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpAcos:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = acos(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpAtan:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = atan(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpSinh:
  case EOpCosh:
  case EOpTanh:
  case EOpAsinh:
  case EOpAcosh:
  case EOpAtanh:
  case EOpPow:
  case EOpModf:
  case EOpMin:
  case EOpMax:
  case EOpClamp:
  case EOpMix:
  case EOpStep:
  case EOpSmoothStep:
    goto switchD_0036cdd9_caseD_41;
  case EOpExp:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = exp(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpLog:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = log(*(double *)
                  ((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpExp2:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = exp2(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpLog2:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = log2(*(double *)
                   ((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    break;
  case EOpSqrt:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    break;
  case EOpInverseSqrt:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar17 = 1.0 / dVar17;
    goto LAB_0036d3f7;
  case EOpAbs:
    pTVar7 = (((this->constArray).unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = *(int *)((long)&pTVar7->type + lVar10);
    puVar11 = (ulong *)((long)&pTVar7->field_0 + lVar10);
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar3 == 8) {
      uVar15 = (uint)*puVar11;
      uVar4 = -uVar15;
      if (0 < (int)uVar15) {
        uVar4 = uVar15;
      }
LAB_0036d488:
      *(uint *)((long)&pTVar7->field_0 + lVar10) = uVar4;
      *(undefined4 *)((long)&pTVar7->type + lVar10) = 8;
      goto LAB_0036d7fd;
    }
    if (iVar3 != 2) {
      puVar8 = (ulong *)((long)&pTVar7->field_0 + lVar10);
      *(int *)(puVar8 + 1) = (int)puVar11[1];
      *puVar8 = *puVar11;
      goto LAB_0036d7fd;
    }
    uVar16 = *puVar11 & 0x7fffffffffffffff;
    goto LAB_0036d251;
  case EOpSign:
    pTVar1 = (((this->constArray).unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(int *)((long)&pTVar1->type + lVar10) != 2) {
      iVar3 = *(int *)((long)&pTVar1->field_0 + lVar10);
      uVar4 = iVar3 >> 0x1f | 1;
      if (iVar3 == 0) {
        uVar4 = 0;
      }
      goto LAB_0036d488;
    }
    dVar17 = *(double *)((long)&pTVar1->field_0 + lVar10);
    uVar16 = ~-(ulong)(dVar17 == 0.0) & *(ulong *)(&DAT_0060e750 + (ulong)(dVar17 < 0.0) * 8);
LAB_0036d251:
    *(ulong *)((long)&pTVar7->field_0 + lVar10) = uVar16;
    goto LAB_0036d7f4;
  case EOpFloor:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    goto LAB_0036d37a;
  case EOpTrunc:
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (dVar17 <= 0.0) goto LAB_0036d381;
    goto LAB_0036d37a;
  case EOpRound:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) + 0.5;
LAB_0036d37a:
    dVar17 = floor(dVar17);
    break;
  case EOpRoundEven:
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    dVar18 = floor(dVar17);
    dVar18 = dVar18 * 0.5;
    dVar19 = floor(dVar18);
    if ((dVar18 != dVar19) || (NAN(dVar18) || NAN(dVar19))) {
      dVar17 = floor(dVar17 + 0.5);
    }
    else {
      dVar17 = ceil(dVar17 + -0.5);
    }
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0036d7ee:
    *(double *)((long)&pTVar7->field_0 + lVar10) = dVar17;
LAB_0036d7f4:
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 2;
    goto LAB_0036d7fd;
  case EOpCeil:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
LAB_0036d381:
    dVar17 = ceil(dVar17);
    break;
  case EOpFract:
    dVar17 = *(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar18 = floor(dVar17);
    dVar17 = dVar17 - dVar18;
LAB_0036d3f7:
    *(double *)((long)&pTVar7->field_0 + lVar10) = dVar17;
    goto LAB_0036d3d3;
  case EOpIsNan:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(bool *)((long)&pTVar7->field_0 + lVar10) =
         NAN(*(double *)
              ((long)&((((this->constArray).unionArray)->
                       super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ).
                       super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                       ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
    goto LAB_0036d348;
  case EOpIsInf:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(bool *)((long)&pTVar7->field_0 + lVar10) =
         (*(ulong *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) &
         0x7fffffffffffffff) == 0x7ff0000000000000;
LAB_0036d348:
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 0xc;
    goto LAB_0036d7fd;
  default:
    if (op - EOpDPdx < 9) {
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pTVar7->field_0 + lVar10) = 0;
      goto LAB_0036d7f4;
    }
    switch(op) {
    case EOpNegative:
      goto switchD_0036ce38_caseD_8;
    case EOpLogicalNot:
    case EOpVectorLogicalNot:
      iVar3 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
      iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_00,iVar3));
      if (iVar3 != 0xc) {
        return (TIntermTyped *)0x0;
      }
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(byte *)((long)&pTVar7->field_0 + lVar10) =
           *(byte *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) ^ 1;
      goto LAB_0036d348;
    case EOpBitwiseNot:
      TVar20 = TConstUnion::operator~
                         ((TConstUnion *)
                          ((long)&((((this->constArray).unionArray)->
                                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ).
                                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10));
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ((anon_union_8_11_a9b10978_for_TConstUnion_0 *)((long)&pTVar7->field_0 + lVar10))->i64Const =
           (longlong)TVar20.field_0;
      *(TBasicType *)((long)&pTVar7->type + lVar10) = TVar20.type;
      goto LAB_0036d7fd;
    case EOpPostIncrement:
    case EOpPostDecrement:
    case EOpPreIncrement:
    case EOpPreDecrement:
    case EOpCopyObject:
    case EOpDeclare:
      goto switchD_0036cdd9_caseD_41;
    case EOpConvNumeric:
      iVar3 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
      uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x38))
                        ((long *)CONCAT44(extraout_var_02,iVar3));
      switch(uVar6) {
      case 1:
      case 2:
      case 3:
        local_60 = 0;
        goto LAB_0036d68a;
      case 4:
        break;
      case 5:
        goto LAB_0036d661;
      case 6:
        break;
      case 7:
        goto LAB_0036d661;
      case 8:
        break;
      case 9:
        goto LAB_0036d661;
      case 10:
        break;
      case 0xb:
LAB_0036d661:
        lStack_a0 = 2;
        goto LAB_0036d67b;
      case 0xc:
        local_60 = 3;
        goto LAB_0036d68a;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x223,
                      "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                     );
      }
      lStack_a0 = 1;
LAB_0036d67b:
      local_60 = lStack_a0;
LAB_0036d68a:
      iVar3 = (*returnType->_vptr_TType[7])();
      switch(iVar3) {
      case 1:
      case 2:
      case 3:
        pTVar9 = (TIntermTyped *)
                 (*(code *)(&DAT_0060e268 + *(int *)(&DAT_0060e268 + local_60 * 4)))();
        return pTVar9;
      case 4:
      case 6:
      case 8:
      case 10:
        pTVar9 = (TIntermTyped *)
                 (*(code *)(&DAT_0060e258 + *(int *)(&DAT_0060e258 + local_60 * 4)))();
        return pTVar9;
      case 5:
      case 7:
      case 9:
      case 0xb:
        pTVar9 = (TIntermTyped *)
                 (*(code *)(&DAT_0060e248 + *(int *)(&DAT_0060e248 + local_60 * 4)))();
        return pTVar9;
      case 0xc:
        pTVar9 = (TIntermTyped *)
                 (*(code *)(&DAT_0060e238 + *(int *)(&DAT_0060e238 + local_60 * 4)))();
        return pTVar9;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x23d,
                      "virtual TIntermTyped *glslang::TIntermConstantUnion::fold(TOperator, const TType &) const"
                     );
      }
    case EOpConvUint64ToPtr:
    case EOpConvPtrToUint64:
      goto switchD_0036ce38_caseD_13;
    default:
      if (op != EOpConstructReference) {
        return (TIntermTyped *)0x0;
      }
switchD_0036ce38_caseD_13:
      pTVar7 = ((newConstArray.unionArray)->
               super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
               super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&pTVar7->field_0 + lVar10) =
           *(undefined8 *)
            ((long)&((((this->constArray).unionArray)->
                     super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ).
                     super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                     ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
LAB_0036cea6:
      *(undefined4 *)((long)&pTVar7->type + lVar10) = 0xb;
      goto LAB_0036d7fd;
    }
  }
  *(double *)((long)&pTVar7->field_0 + lVar10) = dVar17;
LAB_0036d3d3:
  *(undefined4 *)((long)&pTVar7->type + lVar10) = 2;
LAB_0036d7fd:
  lVar10 = lVar10 + 0x10;
  goto LAB_0036cdbd;
switchD_0036ce38_caseD_8:
  iVar3 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(this);
  uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x38))
                    ((long *)CONCAT44(extraout_var_01,iVar3));
  this_00 = (TIntermConstantUnion *)0x0;
  switch(uVar6) {
  case 1:
  case 2:
  case 3:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = *(ulong *)((long)&((((this->constArray).unionArray)->
                                super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ).
                                super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10) ^
             0x8000000000000000;
    goto LAB_0036d251;
  case 4:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(char *)((long)&pTVar7->field_0 + lVar10) =
         -*(char *)((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 4;
    break;
  case 5:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(char *)((long)&pTVar7->field_0 + lVar10) =
         -*(char *)((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 5;
    break;
  case 6:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(short *)((long)&pTVar7->field_0 + lVar10) =
         -*(short *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 6;
    break;
  case 7:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(short *)((long)&pTVar7->field_0 + lVar10) =
         -*(short *)((long)&((((this->constArray).unionArray)->
                             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ).
                             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 7;
    break;
  case 8:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = -*(int *)((long)&((((this->constArray).unionArray)->
                              super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ).
                              super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    goto LAB_0036d488;
  case 9:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(int *)((long)&pTVar7->field_0 + lVar10) =
         -*(int *)((long)&((((this->constArray).unionArray)->
                           super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ).
                           super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 9;
    break;
  case 10:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(long *)((long)&pTVar7->field_0 + lVar10) =
         -*(long *)((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    *(undefined4 *)((long)&pTVar7->type + lVar10) = 10;
    break;
  case 0xb:
    pTVar7 = ((newConstArray.unionArray)->
             super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>).
             super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(long *)((long)&pTVar7->field_0 + lVar10) =
         -*(long *)((long)&((((this->constArray).unionArray)->
                            super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ).
                            super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                            ._M_impl.super__Vector_impl_data._M_start)->field_0 + lVar10);
    goto LAB_0036cea6;
  default:
    goto switchD_0036cdd9_caseD_41;
  }
  goto LAB_0036d7fd;
}

Assistant:

TIntermTyped* TIntermConstantUnion::fold(TOperator op, const TType& returnType) const
{
    // First, size the result, which is mostly the same as the argument's size,
    // but not always, and classify what is componentwise.
    // Also, eliminate cases that can't be compile-time constant.
    int resultSize;
    bool componentWise = true;

    int objectSize = getType().computeNumComponents();
    switch (op) {
    case EOpDeterminant:
    case EOpAny:
    case EOpAll:
    case EOpLength:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpEmitStreamVertex:
    case EOpEndStreamPrimitive:
        // These don't fold
        return nullptr;

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
        componentWise = false;
        resultSize = 1;
        break;

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:
        componentWise = false;
        resultSize = 2;
        break;

    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:
    case EOpNormalize:
        componentWise = false;
        resultSize = objectSize;
        break;

    default:
        resultSize = objectSize;
        break;
    }

    // Set up for processing
    TConstUnionArray newConstArray(resultSize);
    const TConstUnionArray& unionArray = getConstArray();

    // Process non-component-wise operations
    switch (op) {
    case EOpLength:
    case EOpNormalize:
    {
        double sum = 0;
        for (int i = 0; i < objectSize; i++)
            sum += unionArray[i].getDConst() * unionArray[i].getDConst();
        double length = sqrt(sum);
        if (op == EOpLength)
            newConstArray[0].setDConst(length);
        else {
            for (int i = 0; i < objectSize; i++)
                newConstArray[i].setDConst(unionArray[i].getDConst() / length);
        }
        break;
    }

    case EOpAny:
    {
        bool result = false;
        for (int i = 0; i < objectSize; i++) {
            if (unionArray[i].getBConst())
                result = true;
        }
        newConstArray[0].setBConst(result);
        break;
    }
    case EOpAll:
    {
        bool result = true;
        for (int i = 0; i < objectSize; i++) {
            if (! unionArray[i].getBConst())
                result = false;
        }
        newConstArray[0].setBConst(result);
        break;
    }

    case EOpPackSnorm2x16:
    case EOpPackUnorm2x16:
    case EOpPackHalf2x16:
    case EOpPack16:
    case EOpPack32:
    case EOpPack64:
    case EOpUnpack32:
    case EOpUnpack16:
    case EOpUnpack8:

    case EOpUnpackSnorm2x16:
    case EOpUnpackUnorm2x16:
    case EOpUnpackHalf2x16:

    case EOpDeterminant:
    case EOpMatrixInverse:
    case EOpTranspose:
        return nullptr;

    default:
        assert(componentWise);
        break;
    }

    // Turn off the componentwise loop
    if (! componentWise)
        objectSize = 0;

    // Process component-wise operations
    for (int i = 0; i < objectSize; i++) {
        // First read the value and convert to i64/u64/f64/bool, then convert
        // to the destination type (still 64b), then convert down to the
        // destination size.
        if (IsOpNumericConv(op)) {
            enum ConvType { CONV_FLOAT, CONV_INT, CONV_UINT, CONV_BOOL };
            ConvType srcType = CONV_UINT, dstType = CONV_UINT;
            double valf = 0.0;
            uint64_t valu = 0;
            int64_t vali = 0;
            bool valb = false;
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                valf = unionArray[i].getDConst();
                srcType = CONV_FLOAT;
                break;
            case EbtInt8:
                vali = unionArray[i].getI8Const();
                srcType = CONV_INT;
                break;
            case EbtInt16:
                vali = unionArray[i].getI16Const();
                srcType = CONV_INT;
                break;
            case EbtInt:
                vali = unionArray[i].getIConst();
                srcType = CONV_INT;
                break;
            case EbtInt64:
                vali = unionArray[i].getI64Const();
                srcType = CONV_INT;
                break;
            case EbtUint8:
                valu = unionArray[i].getU8Const();
                srcType = CONV_UINT;
                break;
            case EbtUint16:
                valu = unionArray[i].getU16Const();
                srcType = CONV_UINT;
                break;
            case EbtUint:
                valu = unionArray[i].getUConst();
                srcType = CONV_UINT;
                break;
            case EbtUint64:
                valu = unionArray[i].getU64Const();
                srcType = CONV_UINT;
                break;
            case EbtBool:
                valb = unionArray[i].getBConst();
                srcType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }

            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                dstType = CONV_FLOAT;
                break;
            case EbtInt8:
            case EbtInt16:
            case EbtInt:
            case EbtInt64:
                dstType = CONV_INT;
                break;
            case EbtUint8:
            case EbtUint16:
            case EbtUint:
            case EbtUint64:
                dstType = CONV_UINT;
                break;
            case EbtBool:
                dstType = CONV_BOOL;
                break;
            default:
                assert(0);
                break;
            }
            if (dstType == CONV_BOOL) {
                switch (srcType) {
                case CONV_FLOAT:
                    valb = (valf != 0.0); break;
                case CONV_INT:
                    valb = (vali != 0.0); break;
                case CONV_UINT:
                    valb = (valu != 0.0); break;
                default:
                    break;
                }
            } else if (dstType == CONV_FLOAT) {
                switch (srcType) {
                case CONV_BOOL:
                    valf = (double)valb; break;
                case CONV_INT:
                    valf = (double)vali; break;
                case CONV_UINT:
                    valf = (double)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_INT) {
                switch (srcType) {
                case CONV_BOOL:
                    vali = (int64_t)valb; break;
                case CONV_FLOAT:
                    vali = (int64_t)valf; break;
                case CONV_UINT:
                    vali = (int64_t)valu; break;
                default:
                    break;
                }
            } else if (dstType == CONV_UINT) {
                switch (srcType) {
                case CONV_BOOL:
                    valu = (uint64_t)valb; break;
                case CONV_FLOAT:
                    valu = (uint64_t)valf; break;
                case CONV_INT:
                    valu = (uint64_t)vali; break;
                default:
                    break;
                }
            }
            switch (returnType.getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat:
                newConstArray[i].setDConst(valf); break;
            case EbtInt8:
                newConstArray[i].setI8Const(static_cast<int8_t>(vali)); break;
            case EbtInt16:
                newConstArray[i].setI16Const(static_cast<int16_t>(vali)); break;
            case EbtInt:
                newConstArray[i].setIConst(static_cast<int32_t>(vali)); break;
            case EbtInt64:
                newConstArray[i].setI64Const(vali); break;
            case EbtUint8:
                newConstArray[i].setU8Const(static_cast<uint8_t>(valu)); break;
            case EbtUint16:
                newConstArray[i].setU16Const(static_cast<uint16_t>(valu)); break;
            case EbtUint:
                newConstArray[i].setUConst(static_cast<uint32_t>(valu)); break;
            case EbtUint64:
                newConstArray[i].setU64Const(valu); break;
            case EbtBool:
                newConstArray[i].setBConst(valb); break;
            default:
                assert(0);
                break;
            }
            continue;
        }
        switch (op) {
        case EOpNegative:
            switch (getType().getBasicType()) {
            case EbtDouble:
            case EbtFloat16:
            case EbtFloat: newConstArray[i].setDConst(-unionArray[i].getDConst()); break;
            // Note: avoid UBSAN error regarding negating 0x80000000
            case EbtInt:   newConstArray[i].setIConst(
                                static_cast<unsigned int>(unionArray[i].getIConst()) == 0x80000000
                                    ? -0x7FFFFFFF - 1
                                    : -unionArray[i].getIConst());
                           break;
            case EbtUint:  newConstArray[i].setUConst(static_cast<unsigned int>(-static_cast<int>(unionArray[i].getUConst())));  break;
            case EbtInt8:  newConstArray[i].setI8Const(-unionArray[i].getI8Const()); break;
            case EbtUint8: newConstArray[i].setU8Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU8Const())));  break;
            case EbtInt16: newConstArray[i].setI16Const(-unionArray[i].getI16Const()); break;
            case EbtUint16:newConstArray[i].setU16Const(static_cast<unsigned int>(-static_cast<signed int>(unionArray[i].getU16Const())));  break;
            case EbtInt64: {
                int64_t i64val = unionArray[i].getI64Const();
                newConstArray[i].setI64Const(i64val == INT64_MIN ? INT64_MIN : -i64val);
                break;
            }
            case EbtUint64: newConstArray[i].setU64Const(static_cast<unsigned long long>(-static_cast<long long>(unionArray[i].getU64Const())));  break;
            default:
                return nullptr;
            }
            break;
        case EOpLogicalNot:
        case EOpVectorLogicalNot:
            switch (getType().getBasicType()) {
            case EbtBool:  newConstArray[i].setBConst(!unionArray[i].getBConst()); break;
            default:
                return nullptr;
            }
            break;
        case EOpBitwiseNot:
            newConstArray[i] = ~unionArray[i];
            break;
        case EOpRadians:
            newConstArray[i].setDConst(unionArray[i].getDConst() * pi / 180.0);
            break;
        case EOpDegrees:
            newConstArray[i].setDConst(unionArray[i].getDConst() * 180.0 / pi);
            break;
        case EOpSin:
            newConstArray[i].setDConst(sin(unionArray[i].getDConst()));
            break;
        case EOpCos:
            newConstArray[i].setDConst(cos(unionArray[i].getDConst()));
            break;
        case EOpTan:
            newConstArray[i].setDConst(tan(unionArray[i].getDConst()));
            break;
        case EOpAsin:
            newConstArray[i].setDConst(asin(unionArray[i].getDConst()));
            break;
        case EOpAcos:
            newConstArray[i].setDConst(acos(unionArray[i].getDConst()));
            break;
        case EOpAtan:
            newConstArray[i].setDConst(atan(unionArray[i].getDConst()));
            break;

        case EOpDPdx:
        case EOpDPdy:
        case EOpFwidth:
        case EOpDPdxFine:
        case EOpDPdyFine:
        case EOpFwidthFine:
        case EOpDPdxCoarse:
        case EOpDPdyCoarse:
        case EOpFwidthCoarse:
            // The derivatives are all mandated to create a constant 0.
            newConstArray[i].setDConst(0.0);
            break;

        case EOpExp:
            newConstArray[i].setDConst(exp(unionArray[i].getDConst()));
            break;
        case EOpLog:
            newConstArray[i].setDConst(log(unionArray[i].getDConst()));
            break;
        case EOpExp2:
            newConstArray[i].setDConst(exp2(unionArray[i].getDConst()));
            break;
        case EOpLog2:
            newConstArray[i].setDConst(log2(unionArray[i].getDConst()));
            break;
        case EOpSqrt:
            newConstArray[i].setDConst(sqrt(unionArray[i].getDConst()));
            break;
        case EOpInverseSqrt:
            newConstArray[i].setDConst(1.0 / sqrt(unionArray[i].getDConst()));
            break;

        case EOpAbs:
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(fabs(unionArray[i].getDConst()));
            else if (unionArray[i].getType() == EbtInt)
                newConstArray[i].setIConst(abs(unionArray[i].getIConst()));
            else
                newConstArray[i] = unionArray[i];
            break;
        case EOpSign:
            #define SIGN(X) (X == 0 ? 0 : (X < 0 ? -1 : 1))
            if (unionArray[i].getType() == EbtDouble)
                newConstArray[i].setDConst(SIGN(unionArray[i].getDConst()));
            else
                newConstArray[i].setIConst(SIGN(unionArray[i].getIConst()));
            break;
        case EOpFloor:
            newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            break;
        case EOpTrunc:
            if (unionArray[i].getDConst() > 0)
                newConstArray[i].setDConst(floor(unionArray[i].getDConst()));
            else
                newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpRound:
            newConstArray[i].setDConst(floor(0.5 + unionArray[i].getDConst()));
            break;
        case EOpRoundEven:
        {
            double flr = floor(unionArray[i].getDConst());
            bool even = flr / 2.0 == floor(flr / 2.0);
            double rounded = even ? ceil(unionArray[i].getDConst() - 0.5) : floor(unionArray[i].getDConst() + 0.5);
            newConstArray[i].setDConst(rounded);
            break;
        }
        case EOpCeil:
            newConstArray[i].setDConst(ceil(unionArray[i].getDConst()));
            break;
        case EOpFract:
        {
            double x = unionArray[i].getDConst();
            newConstArray[i].setDConst(x - floor(x));
            break;
        }

        case EOpIsNan:
        {
            newConstArray[i].setBConst(std::isnan(unionArray[i].getDConst()));
            break;
        }
        case EOpIsInf:
        {
            newConstArray[i].setBConst(std::isinf(unionArray[i].getDConst()));
            break;
        }

        case EOpConvPtrToUint64:
        case EOpConvUint64ToPtr:
        case EOpConstructReference:
            newConstArray[i].setU64Const(unionArray[i].getU64Const()); break;

        // TODO: 3.0 Functionality: unary constant folding: the rest of the ops have to be fleshed out

        case EOpSinh:
        case EOpCosh:
        case EOpTanh:
        case EOpAsinh:
        case EOpAcosh:
        case EOpAtanh:

        case EOpFloatBitsToInt:
        case EOpFloatBitsToUint:
        case EOpIntBitsToFloat:
        case EOpUintBitsToFloat:
        case EOpDoubleBitsToInt64:
        case EOpDoubleBitsToUint64:
        case EOpInt64BitsToDouble:
        case EOpUint64BitsToDouble:
        case EOpFloat16BitsToInt16:
        case EOpFloat16BitsToUint16:
        case EOpInt16BitsToFloat16:
        case EOpUint16BitsToFloat16:
        default:
            return nullptr;
        }
    }

    TIntermConstantUnion *newNode = new TIntermConstantUnion(newConstArray, returnType);
    newNode->getWritableType().getQualifier().storage = EvqConst;
    newNode->setLoc(getLoc());

    return newNode;
}